

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack12(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x14;
    out_local[1] = *in_local >> 8 & 0xfff;
    out_local[2] = (*in_local & 0xff) << 4;
    out_local[2] = in_local[1] >> 0x1c | out_local[2];
    out_local[3] = in_local[1] >> 0x10 & 0xfff;
    out_local[4] = in_local[1] >> 4 & 0xfff;
    out_local[5] = (in_local[1] & 0xf) << 8;
    out_local[5] = in_local[2] >> 0x18 | out_local[5];
    out_local[6] = in_local[2] >> 0xc & 0xfff;
    out_local[7] = in_local[2] & 0xfff;
    out_local[8] = in_local[3] >> 0x14;
    out_local[9] = in_local[3] >> 8 & 0xfff;
    out_local[10] = (in_local[3] & 0xff) << 4;
    out_local[10] = in_local[4] >> 0x1c | out_local[10];
    out_local[0xb] = in_local[4] >> 0x10 & 0xfff;
    out_local[0xc] = in_local[4] >> 4 & 0xfff;
    out_local[0xd] = (in_local[4] & 0xf) << 8;
    out_local[0xd] = in_local[5] >> 0x18 | out_local[0xd];
    out_local[0xe] = in_local[5] >> 0xc & 0xfff;
    out_local[0xf] = in_local[5] & 0xfff;
    out_local[0x10] = in_local[6] >> 0x14;
    out_local[0x11] = in_local[6] >> 8 & 0xfff;
    out_local[0x12] = (in_local[6] & 0xff) << 4;
    out_local[0x12] = in_local[7] >> 0x1c | out_local[0x12];
    out_local[0x13] = in_local[7] >> 0x10 & 0xfff;
    out_local[0x14] = in_local[7] >> 4 & 0xfff;
    out_local[0x15] = (in_local[7] & 0xf) << 8;
    out_local[0x15] = in_local[8] >> 0x18 | out_local[0x15];
    out_local[0x16] = in_local[8] >> 0xc & 0xfff;
    out_local[0x17] = in_local[8] & 0xfff;
    out_local[0x18] = in_local[9] >> 0x14;
    out_local[0x19] = in_local[9] >> 8 & 0xfff;
    out_local[0x1a] = (in_local[9] & 0xff) << 4;
    out_local[0x1a] = in_local[10] >> 0x1c | out_local[0x1a];
    out_local[0x1b] = in_local[10] >> 0x10 & 0xfff;
    out_local[0x1c] = in_local[10] >> 4 & 0xfff;
    out_local[0x1d] = (in_local[10] & 0xf) << 8;
    out_local[0x1d] = in_local[0xb] >> 0x18 | out_local[0x1d];
    out_local[0x1e] = in_local[0xb] >> 0xc & 0xfff;
    out_local[0x1f] = in_local[0xb] & 0xfff;
    out_local = out_local + 0x20;
    in_local = in_local + 0xc;
  }
  return;
}

Assistant:

void __vseblocks_unpack12(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 12, --bs) {
    out[0] = in[0] >> 20;
    out[1] = (in[0] >> 8) & 0x0fff;
    out[2] = (in[0] << 4) & 0x0fff;
    out[2] |= in[1] >> 28;
    out[3] = (in[1] >> 16) & 0x0fff;
    out[4] = (in[1] >> 4) & 0x0fff;
    out[5] = (in[1] << 8) & 0x0fff;
    out[5] |= in[2] >> 24;
    out[6] = (in[2] >> 12) & 0x0fff;
    out[7] = in[2] & 0x0fff;
    out[8] = in[3] >> 20;
    out[9] = (in[3] >> 8) & 0x0fff;
    out[10] = (in[3] << 4) & 0x0fff;
    out[10] |= in[4] >> 28;
    out[11] = (in[4] >> 16) & 0x0fff;
    out[12] = (in[4] >> 4) & 0x0fff;
    out[13] = (in[4] << 8) & 0x0fff;
    out[13] |= in[5] >> 24;
    out[14] = (in[5] >> 12) & 0x0fff;
    out[15] = in[5] & 0x0fff;
    out[16] = in[6] >> 20;
    out[17] = (in[6] >> 8) & 0x0fff;
    out[18] = (in[6] << 4) & 0x0fff;
    out[18] |= in[7] >> 28;
    out[19] = (in[7] >> 16) & 0x0fff;
    out[20] = (in[7] >> 4) & 0x0fff;
    out[21] = (in[7] << 8) & 0x0fff;
    out[21] |= in[8] >> 24;
    out[22] = (in[8] >> 12) & 0x0fff;
    out[23] = in[8] & 0x0fff;
    out[24] = in[9] >> 20;
    out[25] = (in[9] >> 8) & 0x0fff;
    out[26] = (in[9] << 4) & 0x0fff;
    out[26] |= in[10] >> 28;
    out[27] = (in[10] >> 16) & 0x0fff;
    out[28] = (in[10] >> 4) & 0x0fff;
    out[29] = (in[10] << 8) & 0x0fff;
    out[29] |= in[11] >> 24;
    out[30] = (in[11] >> 12) & 0x0fff;
    out[31] = in[11] & 0x0fff;
  }
}